

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::loaditemtocoverage(summarycalc *this)

{
  FILE *__stream;
  value_type vVar1;
  long lVar2;
  char *__filename;
  FILE *__stream_00;
  undefined8 uVar3;
  reference pvVar4;
  size_t local_c0;
  size_t i;
  item itm;
  int local_9c;
  uint nrec;
  int last_item_id;
  longlong sz;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70 [55];
  allocator local_39;
  string local_38 [8];
  string file;
  FILE *fin;
  summarycalc *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"input/items.bin",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    std::__cxx11::string::substr((ulong)&sz,(ulong)local_38);
    std::operator+(local_70,&this->inputpath_);
    std::__cxx11::string::operator=(local_38,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string((string *)&sz);
  }
  __filename = (char *)std::__cxx11::string::c_str();
  __stream_00 = fopen(__filename,"rb");
  __stream = _stderr;
  if (__stream_00 == (FILE *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"FATAL: %s cannot open %s\n","loaditemtocoverage",uVar3);
    exit(1);
  }
  fseek(__stream_00,0,2);
  lVar2 = ftell(__stream_00);
  fseek(__stream_00,0,0);
  local_9c = 0;
  nrec = (uint)lVar2;
  itm.group_id = nrec / 0x14;
  itm.vulnerability_id = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->item_to_coverage_,(ulong)(itm.group_id + 1),&itm.vulnerability_id);
  local_c0 = fread(&i,0x14,1,__stream_00);
  while( true ) {
    vVar1 = i._4_4_;
    if (local_c0 == 0) {
      fclose(__stream_00);
      std::__cxx11::string::~string(local_38);
      return;
    }
    if ((int)i != local_9c + 1) break;
    local_9c = (int)i;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&this->item_to_coverage_,(long)(int)i);
    *pvVar4 = vVar1;
    local_c0 = fread(&i,0x14,1,__stream_00);
  }
  fprintf(_stderr,"FATAL: Item ids are not contiguous or do not start from one");
  exit(-1);
}

Assistant:

void summarycalc::loaditemtocoverage()
{
	FILE* fin = NULL;
	std::string file = ITEMS_FILE;
	if (inputpath_.length() > 0) {
		file = inputpath_ + file.substr(5);
	}
	fin = fopen(file.c_str(), "rb");
	if (fin == NULL) {
		fprintf(stderr, "FATAL: %s cannot open %s\n", __func__, file.c_str());
		exit(EXIT_FAILURE);
	}

	flseek(fin, 0L, SEEK_END);
	long long sz = fltell(fin);
	flseek(fin, 0L, SEEK_SET);
	int last_item_id = 0;
	unsigned int nrec = (unsigned int)sz / (unsigned int)sizeof(item);
	item_to_coverage_.resize(nrec + 1, 0);

	item itm;
	size_t i = fread(&itm, sizeof(itm), 1, fin);
	while (i != 0) {
		last_item_id++;
		if (itm.id != last_item_id) {
			fprintf(stderr, "FATAL: Item ids are not contiguous or do not start from one");
			exit(-1);
		}
		last_item_id = itm.id;
		item_to_coverage_[itm.id] = itm.coverage_id;
		i = fread(&itm, sizeof(itm), 1, fin);
	}
	fclose(fin);

}